

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>,_true>
 __thiscall
duckdb::ListAggregatesBindData::Deserialize(ListAggregatesBindData *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  LogicalType stype;
  
  Deserializer::ReadProperty<duckdb::LogicalType>
            ((Deserializer *)&stype,(field_id_t)deserializer,(char *)0x1);
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)&local_30,(field_id_t)deserializer,(char *)0x2);
  make_uniq<duckdb::ListAggregatesBindData,duckdb::LogicalType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((duckdb *)this,&stype,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_30);
  if (local_30._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  duckdb::LogicalType::~LogicalType(&stype);
  return (unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>_>
          )(unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>_>
            )this;
}

Assistant:

static unique_ptr<ListAggregatesBindData> Deserialize(Deserializer &deserializer) {
		auto stype = deserializer.ReadProperty<LogicalType>(1, "stype");
		auto aggr_expr = deserializer.ReadProperty<unique_ptr<Expression>>(2, "aggr_expr");
		auto result = make_uniq<ListAggregatesBindData>(std::move(stype), std::move(aggr_expr));
		return result;
	}